

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QColorDialogPrivate::newColorTypedIn(QColorDialogPrivate *this,QRgb rgb)

{
  QColorLuminancePicker *this_00;
  long in_FS_OFFSET;
  int v;
  int s;
  int h;
  int local_54;
  int local_50;
  int local_4c [2];
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined6 uStack_40;
  undefined2 uStack_3a;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QDialogPrivate).nativeDialogInUse == false) {
    local_4c[0] = -0x55555556;
    local_50 = -0x55555556;
    local_54 = -0x55555556;
    uStack_3a = 0xaaaa;
    local_4c[1] = 0;
    uStack_44 = 0xffff;
    uStack_42 = 0;
    uStack_40 = 0;
    QColor::setRgb((uint)(local_4c + 1));
    QColor::getHsv(local_4c + 1,local_4c,&local_50,&local_54);
    QtPrivate::QColorPicker::setCol(this->cp,local_4c[0],local_50);
    this_00 = this->lp;
    this_00->val = local_54;
    this_00->hue = local_4c[0];
    this_00->sat = local_50;
    if (this_00->pix != (QPixmap *)0x0) {
      (**(code **)(*(long *)this_00->pix + 8))();
    }
    this_00->pix = (QPixmap *)0x0;
    QWidget::repaint(&this_00->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::newColorTypedIn(QRgb rgb)
{
    if (!nativeDialogInUse) {
        int h, s, v;
        rgb2hsv(rgb, h, s, v);
        cp->setCol(h, s);
        lp->setCol(h, s, v);
    }
}